

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O3

int space_mixer_set(uint32_t field,void *value,mixed_segment *segment)

{
  float fVar1;
  uint uVar2;
  space_mixer_data *data;
  space_source **ppsVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  mixed_channel_t mVar7;
  mixed_channel_t mVar8;
  mixed_channel_t mVar9;
  mixed_channel_t mVar10;
  mixed_channel_t mVar11;
  mixed_channel_t mVar12;
  mixed_channel_t mVar13;
  int iVar14;
  mixed_channel_configuration *pmVar15;
  mixed_buffer **ppmVar16;
  ulong uVar17;
  
  data = (space_mixer_data *)segment->data;
  switch(field) {
  case 0xc:
    fVar1 = *value;
    if ((data->location[0] == fVar1) && (!NAN(data->location[0]) && !NAN(fVar1))) {
      if ((data->location[1] == *(float *)((long)value + 4)) &&
         (!NAN(data->location[1]) && !NAN(*(float *)((long)value + 4)))) {
        if ((data->location[2] == *(float *)((long)value + 8)) &&
           (!NAN(data->location[2]) && !NAN(*(float *)((long)value + 8)))) {
          return 1;
        }
      }
    }
    data->location[0] = fVar1;
    data->location[1] = *(float *)((long)value + 4);
    data->location[2] = *(float *)((long)value + 8);
    uVar2 = data->count;
    iVar14 = 1;
    if ((ulong)uVar2 != 0) {
      ppsVar3 = data->sources;
      uVar17 = 0;
      do {
        if (ppsVar3[uVar17] != (space_source *)0x0) {
          ppsVar3[uVar17]->dirty = true;
        }
        uVar17 = uVar17 + 1;
      } while (uVar2 != uVar17);
    }
    break;
  case 0xd:
    fVar1 = *value;
    if ((data->direction[0] == fVar1) && (!NAN(data->direction[0]) && !NAN(fVar1))) {
      if ((data->direction[1] == *(float *)((long)value + 4)) &&
         (!NAN(data->direction[1]) && !NAN(*(float *)((long)value + 4)))) {
        if ((data->direction[2] == *(float *)((long)value + 8)) &&
           (!NAN(data->direction[2]) && !NAN(*(float *)((long)value + 8)))) {
          return 1;
        }
      }
    }
    data->direction[0] = fVar1;
    data->direction[1] = *(float *)((long)value + 4);
    data->direction[2] = *(float *)((long)value + 8);
    recompute_look_at(data);
    uVar2 = data->count;
    iVar14 = 1;
    if ((ulong)uVar2 != 0) {
      ppsVar3 = data->sources;
      uVar17 = 0;
      do {
        if (ppsVar3[uVar17] != (space_source *)0x0) {
          ppsVar3[uVar17]->dirty = true;
        }
        uVar17 = uVar17 + 1;
      } while (uVar2 != uVar17);
    }
    break;
  case 0xe:
    fVar1 = *value;
    if ((data->velocity[0] == fVar1) && (!NAN(data->velocity[0]) && !NAN(fVar1))) {
      if ((data->velocity[1] == *(float *)((long)value + 4)) &&
         (!NAN(data->velocity[1]) && !NAN(*(float *)((long)value + 4)))) {
        if ((data->velocity[2] == *(float *)((long)value + 8)) &&
           (!NAN(data->velocity[2]) && !NAN(*(float *)((long)value + 8)))) {
          return 1;
        }
      }
    }
    data->velocity[0] = fVar1;
    data->velocity[1] = *(float *)((long)value + 4);
    data->velocity[2] = *(float *)((long)value + 8);
    uVar2 = data->count;
    iVar14 = 1;
    if ((ulong)uVar2 != 0) {
      ppsVar3 = data->sources;
      uVar17 = 0;
      do {
        if (ppsVar3[uVar17] != (space_source *)0x0) {
          ppsVar3[uVar17]->dirty = true;
        }
        uVar17 = uVar17 + 1;
      } while (uVar2 != uVar17);
    }
    break;
  case 0xf:
    fVar1 = *value;
    if ((data->up[0] == fVar1) && (!NAN(data->up[0]) && !NAN(fVar1))) {
      if ((data->up[1] == *(float *)((long)value + 4)) &&
         (!NAN(data->up[1]) && !NAN(*(float *)((long)value + 4)))) {
        if ((data->up[2] == *(float *)((long)value + 8)) &&
           (!NAN(data->up[2]) && !NAN(*(float *)((long)value + 8)))) {
          return 1;
        }
      }
    }
    data->up[0] = fVar1;
    data->up[1] = *(float *)((long)value + 4);
    data->up[2] = *(float *)((long)value + 8);
    recompute_look_at(data);
    uVar2 = data->count;
    iVar14 = 1;
    if ((ulong)uVar2 != 0) {
      ppsVar3 = data->sources;
      uVar17 = 0;
      do {
        if (ppsVar3[uVar17] != (space_source *)0x0) {
          ppsVar3[uVar17]->dirty = true;
        }
        uVar17 = uVar17 + 1;
      } while (uVar2 != uVar17);
    }
    break;
  case 0x10:
    data->soundspeed = *value;
    uVar2 = data->count;
    iVar14 = 1;
    if ((ulong)uVar2 != 0) {
      ppsVar3 = data->sources;
      uVar17 = 0;
      do {
        if (ppsVar3[uVar17] != (space_source *)0x0) {
          ppsVar3[uVar17]->dirty = true;
        }
        uVar17 = uVar17 + 1;
      } while (uVar2 != uVar17);
    }
    break;
  case 0x11:
    data->doppler_factor = *value;
    uVar2 = data->count;
    iVar14 = 1;
    if ((ulong)uVar2 != 0) {
      ppsVar3 = data->sources;
      uVar17 = 0;
      do {
        if (ppsVar3[uVar17] != (space_source *)0x0) {
          ppsVar3[uVar17]->dirty = true;
        }
        uVar17 = uVar17 + 1;
      } while (uVar2 != uVar17);
    }
    break;
  case 0x12:
    data->min_distance = *value;
    uVar2 = data->count;
    iVar14 = 1;
    if ((ulong)uVar2 != 0) {
      ppsVar3 = data->sources;
      uVar17 = 0;
      do {
        if (ppsVar3[uVar17] != (space_source *)0x0) {
          ppsVar3[uVar17]->dirty = true;
        }
        uVar17 = uVar17 + 1;
      } while (uVar2 != uVar17);
    }
    break;
  case 0x13:
    data->max_distance = *value;
    uVar2 = data->count;
    iVar14 = 1;
    if ((ulong)uVar2 != 0) {
      ppsVar3 = data->sources;
      uVar17 = 0;
      do {
        if (ppsVar3[uVar17] != (space_source *)0x0) {
          ppsVar3[uVar17]->dirty = true;
        }
        uVar17 = uVar17 + 1;
      } while (uVar2 != uVar17);
    }
    break;
  case 0x14:
    data->rolloff = *value;
    uVar2 = data->count;
    iVar14 = 1;
    if ((ulong)uVar2 != 0) {
      ppsVar3 = data->sources;
      uVar17 = 0;
      do {
        if (ppsVar3[uVar17] != (space_source *)0x0) {
          ppsVar3[uVar17]->dirty = true;
        }
        uVar17 = uVar17 + 1;
      } while (uVar2 != uVar17);
    }
    break;
  case 0x15:
    if (*value - 1U < 4) {
      value = (&PTR_attenuation_none_002bac40)[*value - 1U];
    }
    data->attenuation = (_func_float_float_float_float_float *)value;
    uVar2 = data->count;
    iVar14 = 1;
    if ((ulong)uVar2 != 0) {
      ppsVar3 = data->sources;
      uVar17 = 0;
      do {
        if (ppsVar3[uVar17] != (space_source *)0x0) {
          ppsVar3[uVar17]->dirty = true;
        }
        uVar17 = uVar17 + 1;
      } while (uVar2 != uVar17);
    }
    break;
  case 0x25:
    pmVar15 = mixed_default_channel_configuration(*value);
    mVar7 = pmVar15->positions[0];
    mVar8 = pmVar15->positions[1];
    mVar9 = pmVar15->positions[2];
    mVar10 = pmVar15->positions[3];
    mVar11 = pmVar15->positions[4];
    mVar12 = pmVar15->positions[5];
    mVar13 = pmVar15->positions[6];
    uVar4 = *(undefined8 *)(pmVar15->positions + 7);
    uVar5 = *(undefined8 *)(pmVar15->positions + 0xf);
    uVar6 = *(undefined8 *)(pmVar15->positions + 0x17);
    (data->channels).count = pmVar15->count;
    (data->channels).positions[0] = mVar7;
    (data->channels).positions[1] = mVar8;
    (data->channels).positions[2] = mVar9;
    (data->channels).positions[3] = mVar10;
    (data->channels).positions[4] = mVar11;
    (data->channels).positions[5] = mVar12;
    (data->channels).positions[6] = mVar13;
    *(undefined8 *)((data->channels).positions + 7) = uVar4;
    *(undefined8 *)((data->channels).positions + 0xf) = uVar5;
    *(undefined8 *)((data->channels).positions + 0x17) = uVar6;
    *(undefined2 *)((data->channels).positions + 0x1f) = *(undefined2 *)(pmVar15->positions + 0x1f);
    iVar14 = make_vbap_from_configuration(&data->channels,&data->vbap);
    if (iVar14 == 0) {
      return 0;
    }
    ppmVar16 = (mixed_buffer **)(*mixed_realloc)(data->out,(ulong)(data->channels).count << 3);
    data->out = ppmVar16;
    if (ppmVar16 != (mixed_buffer **)0x0) {
      iVar14 = mixed_configuration_is_surround(&data->channels);
      data->surround = iVar14 != 0;
      uVar2 = data->count;
      if ((ulong)uVar2 != 0) {
        ppsVar3 = data->sources;
        uVar17 = 0;
        do {
          if (ppsVar3[uVar17] != (space_source *)0x0) {
            ppsVar3[uVar17]->dirty = true;
          }
          uVar17 = uVar17 + 1;
        } while (uVar2 != uVar17);
        return 1;
      }
      return 1;
    }
LAB_001456e4:
    iVar14 = 0;
    mixed_err(1);
    break;
  default:
    if (field == 0x3d) {
      *(undefined2 *)((data->channels).positions + 0x1f) = *(undefined2 *)((long)value + 0x20);
      uVar4 = *value;
      uVar5 = *(undefined8 *)((long)value + 8);
      uVar6 = *(undefined8 *)((long)value + 0x18);
      *(undefined8 *)((data->channels).positions + 0xf) = *(undefined8 *)((long)value + 0x10);
      *(undefined8 *)((data->channels).positions + 0x17) = uVar6;
      (data->channels).count = (char)uVar4;
      (data->channels).positions[0] = (char)((ulong)uVar4 >> 8);
      (data->channels).positions[1] = (char)((ulong)uVar4 >> 0x10);
      (data->channels).positions[2] = (char)((ulong)uVar4 >> 0x18);
      (data->channels).positions[3] = (char)((ulong)uVar4 >> 0x20);
      (data->channels).positions[4] = (char)((ulong)uVar4 >> 0x28);
      (data->channels).positions[5] = (char)((ulong)uVar4 >> 0x30);
      (data->channels).positions[6] = (char)((ulong)uVar4 >> 0x38);
      *(undefined8 *)((data->channels).positions + 7) = uVar5;
      iVar14 = make_vbap_from_configuration(&data->channels,&data->vbap);
      if (iVar14 == 0) {
        return 0;
      }
      ppmVar16 = (mixed_buffer **)(*mixed_realloc)(data->out,(ulong)(data->channels).count << 3);
      data->out = ppmVar16;
      if (ppmVar16 != (mixed_buffer **)0x0) {
        iVar14 = mixed_configuration_is_surround(&data->channels);
        data->surround = iVar14 != 0;
        uVar2 = data->count;
        if ((ulong)uVar2 != 0) {
          ppsVar3 = data->sources;
          uVar17 = 0;
          do {
            if (ppsVar3[uVar17] != (space_source *)0x0) {
              ppsVar3[uVar17]->dirty = true;
            }
            uVar17 = uVar17 + 1;
          } while (uVar2 != uVar17);
          return 1;
        }
        return 1;
      }
      goto LAB_001456e4;
    }
    if (field == 3) {
      data->volume = *value;
      return 1;
    }
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
    mixed_err(7);
    iVar14 = 0;
  }
  return iVar14;
}

Assistant:

int space_mixer_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct space_mixer_data *data = (struct space_mixer_data *)segment->data;
  float *parts = (float *)value;
  switch(field){
  case MIXED_VOLUME:
    data->volume = *((float *)value);
    break;
  case MIXED_SPACE_LOCATION:
    if(data->location[0] != parts[0] ||
       data->location[1] != parts[1] ||
       data->location[2] != parts[2]){
      data->location[0] = parts[0];
      data->location[1] = parts[1];
      data->location[2] = parts[2];
      mark_sources_dirty(data);
    }
    break;
  case MIXED_SPACE_VELOCITY:
    if(data->velocity[0] != parts[0] ||
       data->velocity[1] != parts[1] ||
       data->velocity[2] != parts[2]){
      data->velocity[0] = parts[0];
      data->velocity[1] = parts[1];
      data->velocity[2] = parts[2];
      mark_sources_dirty(data);
    }
    break;
  case MIXED_SPACE_DIRECTION:
    if(data->direction[0] != parts[0] ||
       data->direction[1] != parts[1] ||
       data->direction[2] != parts[2]){
      data->direction[0] = parts[0];
      data->direction[1] = parts[1];
      data->direction[2] = parts[2];
      recompute_look_at(data);
      mark_sources_dirty(data);
    }
    break;
  case MIXED_SPACE_UP:
    if(data->up[0] != parts[0] ||
       data->up[1] != parts[1] ||
       data->up[2] != parts[2]){
      data->up[0] = parts[0];
      data->up[1] = parts[1];
      data->up[2] = parts[2];
      recompute_look_at(data);
      mark_sources_dirty(data);
    }
    break;
  case MIXED_SPACE_SOUNDSPEED:
    data->soundspeed = *(float *)value;
    mark_sources_dirty(data);
    break;
  case MIXED_SPACE_DOPPLER_FACTOR:
    data->doppler_factor = *(float *)value;
    mark_sources_dirty(data);
    break;
  case MIXED_SPACE_MIN_DISTANCE:
    data->min_distance = *(float *)value;
    mark_sources_dirty(data);
    break;
  case MIXED_SPACE_MAX_DISTANCE:
    data->max_distance = *(float *)value;
    mark_sources_dirty(data);
    break;
  case MIXED_SPACE_ROLLOFF:
    data->rolloff = *(float *)value;
    mark_sources_dirty(data);
    break;
  case MIXED_SPACE_ATTENUATION:
    switch(*(uint32_t *)value){
    case MIXED_NO_ATTENUATION:
      data->attenuation = attenuation_none;
      break;
    case MIXED_INVERSE_ATTENUATION:
      data->attenuation = attenuation_inverse;
      break;
    case MIXED_LINEAR_ATTENUATION:
      data->attenuation = attenuation_linear;
      break;
    case MIXED_EXPONENTIAL_ATTENUATION:
      data->attenuation = attenuation_exponential;
      break;
    default:
      data->attenuation = (float (*)(float min, float max, float dist, float roll))value;
      break;
    }
    mark_sources_dirty(data);
    break;
  case MIXED_OUT_COUNT:
    memcpy(&data->channels, mixed_default_channel_configuration(*(uint32_t *)value), sizeof(struct mixed_channel_configuration));
    if(!make_vbap_from_configuration(&data->channels, &data->vbap)) return 0;
    data->out = mixed_realloc(data->out, data->channels.count*sizeof(struct mixed_buffer *));
    if(!data->out){
      mixed_err(MIXED_OUT_OF_MEMORY);
      return 0;
    }
    data->surround = mixed_configuration_is_surround(&data->channels);
    mark_sources_dirty(data);
    break;
  case MIXED_CHANNEL_CONFIGURATION:
    memcpy(&data->channels, (struct mixed_channel_configuration *)value, sizeof(struct mixed_channel_configuration));
    if(!make_vbap_from_configuration(&data->channels, &data->vbap)) return 0;
    data->out = mixed_realloc(data->out, data->channels.count*sizeof(struct mixed_buffer *));
    if(!data->out){
      mixed_err(MIXED_OUT_OF_MEMORY);
      return 0;
    }
    data->surround = mixed_configuration_is_surround(&data->channels);
    mark_sources_dirty(data);
    break;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
  return 1;
}